

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  code *pcVar1;
  _Setw _Var2;
  env *peVar3;
  ostream *this_00;
  ostream *poVar4;
  string *in_RSI;
  times *in_RDI;
  double dVar5;
  message *anon_var_0;
  timer t;
  timer *in_stack_ffffffffffffff70;
  text *in_stack_ffffffffffffff78;
  env *in_stack_ffffffffffffff80;
  string local_38 [56];
  
  timer::timer(in_stack_ffffffffffffff70);
  pcVar1 = *(code **)(in_RSI + 0x20);
  std::__cxx11::string::string(local_38,in_RSI);
  peVar3 = env::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  (*pcVar1)(peVar3);
  std::__cxx11::string::~string(local_38);
  poVar4 = (in_RDI->super_action).os;
  _Var2 = std::setw(5);
  this_00 = std::operator<<(poVar4,_Var2);
  dVar5 = timer::elapsed_seconds((timer *)poVar4);
  poVar4 = (ostream *)std::ostream::operator<<(this_00,dVar5 * 1000.0);
  poVar4 = std::operator<<(poVar4," ms: ");
  poVar4 = std::operator<<(poVar4,in_RSI);
  std::operator<<(poVar4,"\n");
  return in_RDI;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(5) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }